

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.h
# Opt level: O3

TcpClient * __thiscall Liby::TcpClient::setEventLoop(TcpClient *this,EventLoop *loop)

{
  _Head_base<0UL,_Liby::Poller_*,_false> _Var1;
  
  if (loop == (EventLoop *)0x0) {
    __assert_fail("loop && loop->getPoller()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.h"
                  ,0x19,"TcpClient &Liby::TcpClient::setEventLoop(EventLoop *)");
  }
  if ((loop->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
      _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
      super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl != (Poller *)0x0) {
    this->loop_ = loop;
    _Var1._M_head_impl =
         (loop->poller_)._M_t.
         super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
         super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
         super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (Poller *)0x0) {
      this->poller_ = _Var1._M_head_impl;
      return this;
    }
  }
  __assert_fail("poller_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoop.h"
                ,0xf,"Poller *Liby::EventLoop::getPoller() const");
}

Assistant:

TcpClient &setEventLoop(EventLoop *loop) {
        assert(loop && loop->getPoller());
        loop_ = loop;
        poller_ = loop->getPoller();
        return *this;
    }